

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O0

ptrdiff_t __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::reMax
          (ClassArray<soplex::Nonzero<double>_> *this,int newMax,int newSize)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  ClassArray<soplex::Nonzero<double>_> *in_RDI;
  Nonzero<double> **unaff_retaddr;
  ptrdiff_t pshift;
  int i;
  Nonzero<double> *newMem;
  int local_24;
  int local_18;
  int local_14;
  undefined8 in_stack_fffffffffffffff8;
  long lVar3;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  local_18 = in_EDX;
  if (in_EDX < 0) {
    local_18 = size(in_RDI);
  }
  local_14 = in_ESI;
  if (in_ESI < 1) {
    local_14 = 1;
  }
  if (local_14 < local_18) {
    local_14 = local_18;
  }
  if (local_14 == in_RDI->themax) {
    in_RDI->thesize = local_18;
    lVar3 = 0;
  }
  else {
    spx_alloc<soplex::Nonzero<double>*>(unaff_retaddr,iVar2);
    for (local_24 = 0; iVar2 = size(in_RDI), local_24 < iVar2 && local_24 < local_18;
        local_24 = local_24 + 1) {
      pNVar1 = in_RDI->data;
      *(double *)((long)local_24 * 0x10) = pNVar1[local_24].val;
      ((double *)((long)local_24 * 0x10))[1] = *(double *)&pNVar1[local_24].idx;
    }
    for (; local_24 < local_14; local_24 = local_24 + 1) {
      Nonzero<double>::Nonzero((Nonzero<double> *)((long)local_24 * 0x10));
    }
    lVar3 = -(long)in_RDI->data;
    local_24 = in_RDI->themax;
    do {
      local_24 = local_24 + -1;
    } while (-1 < local_24);
    spx_free<soplex::Nonzero<double>*>((Nonzero<double> **)0x22aef5);
    in_RDI->data = (Nonzero<double> *)0x0;
    in_RDI->themax = local_14;
    in_RDI->thesize = local_18;
  }
  return lVar3;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }